

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_when * lys_when_dup(lys_module *mod,lys_when *old,unres_schema *unres)

{
  LY_ERR *pLVar1;
  ly_ctx *plVar2;
  char *pcVar3;
  lys_when *new;
  unres_schema *unres_local;
  lys_when *old_local;
  lys_module *mod_local;
  
  if (old == (lys_when *)0x0) {
    mod_local = (lys_module *)0x0;
  }
  else {
    mod_local = (lys_module *)calloc(1,0x28);
    if (mod_local == (lys_module *)0x0) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_when_dup");
      mod_local = (lys_module *)0x0;
    }
    else {
      plVar2 = (ly_ctx *)lydict_insert(mod->ctx,old->cond,0);
      mod_local->ctx = plVar2;
      pcVar3 = lydict_insert(mod->ctx,old->dsc,0);
      mod_local->name = pcVar3;
      pcVar3 = lydict_insert(mod->ctx,old->ref,0);
      mod_local->prefix = pcVar3;
      *(uint8_t *)&mod_local->ref = old->ext_size;
      lys_ext_dup(mod,old->ext,old->ext_size,mod_local,LYEXT_PAR_WHEN,
                  (lys_ext_instance ***)&mod_local->dsc,unres);
    }
  }
  return (lys_when *)mod_local;
}

Assistant:

static struct lys_when *
lys_when_dup(struct lys_module *mod, struct lys_when *old, struct unres_schema *unres)
{
    struct lys_when *new;

    if (!old) {
        return NULL;
    }

    new = calloc(1, sizeof *new);
    if (!new) {
        LOGMEM;
        return NULL;
    }
    new->cond = lydict_insert(mod->ctx, old->cond, 0);
    new->dsc = lydict_insert(mod->ctx, old->dsc, 0);
    new->ref = lydict_insert(mod->ctx, old->ref, 0);
    new->ext_size = old->ext_size;
    lys_ext_dup(mod, old->ext, old->ext_size, new, LYEXT_PAR_WHEN, &new->ext, unres);

    return new;
}